

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::findCompositeConstant(Builder *this,Op typeClass,Vector<Id> *comps)

{
  pointer ppIVar1;
  pointer puVar2;
  uint *puVar3;
  bool bVar4;
  ulong uVar5;
  Id IVar6;
  Instruction *pIVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (typeClass == OpTypeCooperativeMatrixKHR) {
    ppIVar1 = (this->coopmatConstants).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (uint)((ulong)((long)(this->coopmatConstants).
                                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
    if (0 < (int)uVar8) {
      uVar9 = 1;
      bVar4 = false;
      do {
        pIVar7 = ppIVar1[uVar9 - 1];
        if (*(pIVar7->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start ==
            *(comps->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
             )._M_impl.super__Vector_impl_data._M_start) {
          bVar4 = true;
        }
      } while ((uVar9 < (uVar8 & 0x7fffffff)) && (uVar9 = uVar9 + 1, !bVar4));
      goto LAB_001b7b9c;
    }
  }
  else {
    ppIVar1 = this->groupedConstants[typeClass].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (uint)((ulong)((long)this->groupedConstants[typeClass].
                                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
    if (0 < (int)uVar8) {
      puVar2 = (comps->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = 0;
      bVar4 = false;
      do {
        pIVar7 = ppIVar1[uVar9];
        puVar3 = (pIVar7->operands).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = (uint)((ulong)((long)*(pointer *)
                                       ((long)&(pIVar7->operands).
                                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                               ._M_impl + 8) - (long)puVar3) >> 2);
        if (uVar10 == (uint)((ulong)((long)(comps->
                                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar2) >> 2)) {
          bVar12 = 0 < (int)uVar10;
          if ((int)uVar10 < 1) {
            bVar4 = true;
          }
          else if (*puVar3 == *puVar2) {
            uVar5 = 1;
            do {
              uVar11 = uVar5;
              if ((uVar10 & 0x7fffffff) == uVar11) {
                bVar4 = true;
                break;
              }
              uVar5 = uVar11 + 1;
            } while (puVar3[uVar11] == puVar2[uVar11]);
            bVar12 = uVar11 < (uVar10 & 0x7fffffff);
          }
          if (!bVar12) break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar8 & 0x7fffffff));
      goto LAB_001b7b9c;
    }
  }
  pIVar7 = (Instruction *)0x0;
  bVar4 = false;
LAB_001b7b9c:
  IVar6 = 0;
  if (bVar4) {
    IVar6 = pIVar7->resultId;
  }
  return IVar6;
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, const dxil_spv::Vector<Id>& comps) const
{
    Instruction* constant = 0;
    bool found = false;

    if (typeClass == spv::OpTypeCooperativeMatrixKHR) {
        for (int i = 0; i < (int)coopmatConstants.size() && !found; ++i) {
            constant = coopmatConstants[i];
            if (constant->getIdOperand(0) == comps[0])
                found = true;
        }
    } else {
        for (int i = 0; i < (int) groupedConstants[typeClass].size(); ++i) {
            constant = groupedConstants[typeClass][i];

            // same shape?
            if (constant->getNumOperands() != (int) comps.size())
                continue;

            // same contents?
            bool mismatch = false;
            for (int op = 0; op < constant->getNumOperands(); ++op)
            {
                if (constant->getIdOperand(op) != comps[op])
                {
                    mismatch = true;
                    break;
                }
            }
            if (!mismatch)
            {
                found = true;
                break;
            }
        }
    }

    return found ? constant->getResultId() : NoResult;
}